

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

int loader_impl_execution_path(plugin p,loader_impl impl,char *path)

{
  set psVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  
  iVar2 = 1;
  if (impl != (loader_impl)0x0) {
    if (impl->init == 0) {
      lVar4 = plugin_iface(p);
      if (lVar4 != 0) {
        iVar2 = (**(code **)(lVar4 + 8))(impl,path);
        return iVar2;
      }
    }
    else {
      psVar1 = impl->exec_path_map;
      uVar3 = plugin_name(p);
      lVar4 = set_get(psVar1,uVar3);
      if (lVar4 == 0) {
        lVar4 = vector_create(0x1000);
        if (lVar4 == 0) {
          return 1;
        }
        psVar1 = impl->exec_path_map;
        uVar3 = plugin_name(p);
        iVar2 = set_insert(psVar1,uVar3,lVar4);
        if (iVar2 != 0) {
          vector_destroy(lVar4);
          return 1;
        }
      }
      vector_push_back(lVar4,path);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int loader_impl_execution_path(plugin p, loader_impl impl, const loader_path path)
{
	if (impl != NULL)
	{
		if (impl->init == 0)
		{
			/* If loader is initialized, load the execution path */
			loader_impl_interface iface = loader_iface(p);

			if (iface != NULL)
			{
				return iface->execution_path(impl, path);
			}
		}
		else
		{
			/* If loader is not initialized, store the execution path for later use */
			vector paths = set_get(impl->exec_path_map, (const set_key)plugin_name(p));

			if (paths == NULL)
			{
				paths = vector_create(sizeof(char) * LOADER_PATH_SIZE);

				if (paths == NULL)
				{
					return 1;
				}

				if (set_insert(impl->exec_path_map, (set_key)plugin_name(p), paths) != 0)
				{
					vector_destroy(paths);

					return 1;
				}
			}

			vector_push_back(paths, (void *)path);

			return 0;
		}
	}

	return 1;
}